

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specwriterimpl.cpp
# Opt level: O3

ssize_t __thiscall
apngasm::spec::priv::JSONSpecWriterImpl::write
          (JSONSpecWriterImpl *this,int __fd,void *__buf,size_t __n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IAPNGAsmListener *pIVar2;
  string *filename;
  bool bVar3;
  void *pvVar4;
  void *pvVar5;
  vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> *pvVar6;
  ostream *poVar7;
  undefined8 extraout_RAX;
  uint uVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  long lVar10;
  ptree frame;
  string file;
  ptree child;
  ptree root;
  ostringstream delay;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  string *local_2b8;
  void *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  self_type local_288;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  path_type local_1a8 [2];
  ios_base local_138 [264];
  
  local_260.m_data._M_dataplus._M_p = (pointer)&local_260.m_data.field_2;
  local_260.m_data._M_string_length = 0;
  local_260.m_data.field_2._M_local_buf[0] = '\0';
  local_2b0 = __buf;
  pvVar4 = operator_new(0x20);
  pvVar5 = operator_new(0x70);
  *(void **)((long)pvVar4 + 8) = pvVar5;
  *(undefined8 *)((long)pvVar5 + 0x48) = 0;
  *(long *)((long)pvVar5 + 0x50) = (long)pvVar5 + 0x48;
  *(long *)((long)pvVar5 + 0x58) = (long)pvVar5 + 0x48;
  *(long *)((long)pvVar5 + 0x68) = (long)pvVar5 + 0x60;
  *(long *)((long)pvVar5 + 0x60) = (long)pvVar5 + 0x60;
  *(undefined8 *)((long)pvVar4 + 0x18) = 0;
  paVar1 = &local_1a8[0].m_value.field_2;
  local_260.m_children = pvVar4;
  local_1a8[0].m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"loops","");
  local_1a8[0].m_separator = '.';
  local_1a8[0].m_start._M_current = local_1a8[0].m_value._M_dataplus._M_p;
  local_288.m_data._M_dataplus._M_p._0_4_ =
       APNGAsm::getLoops((this->super_AbstractSpecWriterImpl)._pApngasm);
  std::locale::locale((locale *)local_1f0);
  std::locale::locale((locale *)&local_238,(locale *)local_1f0);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  put<unsigned_int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,unsigned_int>>
            ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)&local_260,local_1a8,(uint *)&local_288,
             (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_unsigned_int> *)
             &local_238);
  std::locale::~locale((locale *)&local_238);
  std::locale::~locale((locale *)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0].m_value._M_dataplus._M_p,
                    local_1a8[0].m_value.field_2._M_allocated_capacity + 1);
  }
  local_1a8[0].m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"skip_first","");
  local_1a8[0].m_separator = '.';
  local_1a8[0].m_start._M_current = local_1a8[0].m_value._M_dataplus._M_p;
  bVar3 = APNGAsm::isSkipFirst((this->super_AbstractSpecWriterImpl)._pApngasm);
  local_288.m_data._M_dataplus._M_p._0_1_ = bVar3;
  std::locale::locale((locale *)local_1f0);
  std::locale::locale((locale *)&local_238,(locale *)local_1f0);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  put<bool,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,bool>>
            ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)&local_260,local_1a8,(bool *)&local_288,
             (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_bool> *)
             &local_238);
  std::locale::~locale((locale *)&local_238);
  std::locale::~locale((locale *)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0].m_value._M_dataplus._M_p,
                    local_1a8[0].m_value.field_2._M_allocated_capacity + 1);
  }
  local_288.m_data._M_dataplus._M_p = (pointer)&local_288.m_data.field_2;
  local_288.m_data._M_string_length = 0;
  local_288.m_data.field_2._M_local_buf[0] = '\0';
  pvVar4 = operator_new(0x20);
  local_2b8 = (string *)CONCAT44(in_register_00000034,__fd);
  pvVar5 = operator_new(0x70);
  *(void **)((long)pvVar4 + 8) = pvVar5;
  *(undefined8 *)((long)pvVar5 + 0x48) = 0;
  *(long *)((long)pvVar5 + 0x50) = (long)pvVar5 + 0x48;
  *(long *)((long)pvVar5 + 0x58) = (long)pvVar5 + 0x48;
  *(long *)((long)pvVar5 + 0x68) = (long)pvVar5 + 0x60;
  *(long *)((long)pvVar5 + 0x60) = (long)pvVar5 + 0x60;
  *(undefined8 *)((long)pvVar4 + 0x18) = 0;
  local_288.m_children = pvVar4;
  pvVar6 = APNGAsm::getFrames((this->super_AbstractSpecWriterImpl)._pApngasm);
  uVar8 = (int)((long)(pvVar6->
                      super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar6->
                      super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 0x7a44c6b;
  if (0 < (int)uVar8) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      pIVar2 = (this->super_AbstractSpecWriterImpl)._pListener;
      (**(code **)(*(long *)pIVar2 + 0x40))(&local_2a8,pIVar2,local_2b0,uVar9 & 0xffffffff);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      APNGFrame::delayNum((APNGFrame *)
                          ((long)((pvVar6->
                                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_palette +
                          lVar10 + -0x11),0);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
      APNGFrame::delayDen((APNGFrame *)
                          ((long)((pvVar6->
                                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_palette +
                          lVar10 + -0x11),0);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_300.m_data._M_dataplus._M_p = (pointer)&local_300.m_data.field_2;
      local_300.m_data._M_string_length = 0;
      local_300.m_data.field_2._M_local_buf[0] = '\0';
      pvVar4 = operator_new(0x20);
      pvVar5 = operator_new(0x70);
      *(void **)((long)pvVar4 + 8) = pvVar5;
      *(undefined8 *)((long)pvVar5 + 0x48) = 0;
      *(long *)((long)pvVar5 + 0x50) = (long)pvVar5 + 0x48;
      *(long *)((long)pvVar5 + 0x58) = (long)pvVar5 + 0x48;
      *(long *)((long)pvVar5 + 0x68) = (long)pvVar5 + 0x60;
      *(long *)((long)pvVar5 + 0x60) = (long)pvVar5 + 0x60;
      *(undefined8 *)((long)pvVar4 + 0x18) = 0;
      local_300.m_children = pvVar4;
      std::__cxx11::stringbuf::str();
      local_328.m_data._M_dataplus._M_p = (pointer)&local_328.m_data.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_328,local_2d8,local_2d0 + (long)local_2d8);
      pvVar4 = operator_new(0x20);
      pvVar5 = operator_new(0x70);
      *(void **)((long)pvVar4 + 8) = pvVar5;
      *(undefined8 *)((long)pvVar5 + 0x48) = 0;
      *(long *)((long)pvVar5 + 0x50) = (long)pvVar5 + 0x48;
      *(long *)((long)pvVar5 + 0x58) = (long)pvVar5 + 0x48;
      *(long *)((long)pvVar5 + 0x68) = (long)pvVar5 + 0x60;
      *(long *)((long)pvVar5 + 0x60) = (long)pvVar5 + 0x60;
      *(undefined8 *)((long)pvVar4 + 0x18) = 0;
      local_328.m_children = pvVar4;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1f0,&local_2a8,&local_328);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                (&local_238,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1f0);
      boost::multi_index::detail::sequenced_index<$32b8c4dc$>::insert
                ((sequenced_index<_32b8c4dc_> *)((long)local_300.m_children + 0x10),
                 *(sequenced_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                   **)((long)local_300.m_children + 8),&local_238);
      boost::property_tree::
      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~basic_ptree(&local_238.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.first._M_dataplus._M_p != &local_238.first.field_2) {
        operator_delete(local_238.first._M_dataplus._M_p,
                        local_238.first.field_2._M_allocated_capacity + 1);
      }
      boost::property_tree::
      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~basic_ptree(&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._0_8_ != &local_1e0) {
        operator_delete((void *)local_1f0._0_8_,local_1e0._M_allocated_capacity + 1);
      }
      boost::property_tree::
      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~basic_ptree(&local_328);
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
      local_328.m_data._M_dataplus._M_p = "";
      std::
      pair<const_char_*,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
                ((pair<const_char_*,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1f0,(char **)&local_328,&local_300);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<const_char_*,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                (&local_238,
                 (pair<const_char_*,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1f0);
      boost::multi_index::detail::sequenced_index<$32b8c4dc$>::insert
                ((sequenced_index<_32b8c4dc_> *)((long)local_288.m_children + 0x10),
                 *(sequenced_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                   **)((long)local_288.m_children + 8),&local_238);
      boost::property_tree::
      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~basic_ptree(&local_238.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.first._M_dataplus._M_p != &local_238.first.field_2) {
        operator_delete(local_238.first._M_dataplus._M_p,
                        local_238.first.field_2._M_allocated_capacity + 1);
      }
      boost::property_tree::
      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_1f0 + 8));
      boost::property_tree::
      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~basic_ptree(&local_300);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x430;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  paVar1 = &local_1a8[0].m_value.field_2;
  local_1a8[0].m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"frames","");
  local_1a8[0].m_separator = '.';
  local_1a8[0].m_start._M_current = local_1a8[0].m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::add_child(&local_260,local_1a8,&local_288);
  filename = local_2b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0].m_value._M_dataplus._M_p,
                    local_1a8[0].m_value.field_2._M_allocated_capacity + 1);
  }
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_288);
  std::locale::locale((locale *)local_1a8);
  boost::property_tree::json_parser::
  write_json<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (filename,&local_260,(locale *)local_1a8,true);
  std::locale::~locale((locale *)local_1a8);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_260);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool JSONSpecWriterImpl::write(const std::string& filePath, const std::string& imagePathPrefix) const
        {
          boost::property_tree::ptree root;

          // Write apngasm fields.
          // root.put("name", _pApngasm->name());
          root.put("loops", _pApngasm->getLoops());
          root.put("skip_first", _pApngasm->isSkipFirst());

          {
            boost::property_tree::ptree child;
            std::vector<APNGFrame>& frames = const_cast<std::vector<APNGFrame>&>(_pApngasm->getFrames());
            const int count = frames.size();
            for (int i = 0;  i < count;  ++i)
            {
              const std::string file = _pListener->onCreatePngPath(imagePathPrefix, i);

              std::ostringstream delay;
              delay << frames[i].delayNum() << "/" << frames[i].delayDen();

              boost::property_tree::ptree frame;
              frame.push_back(std::make_pair( file, boost::property_tree::ptree(delay.str()) ));

              child.push_back(std::make_pair("", frame));
            }
            root.add_child("frames", child);
          }

          write_json(filePath, root);
          return true;
        }